

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O0

size_t lua_rawlen(lua_State *L,int idx)

{
  uint uVar1;
  int iVar2;
  TValue *pTVar3;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2addr(L,idx);
  uVar1 = pTVar3->tt_ & 0xf;
  if (uVar1 == 4) {
    L_local = *(lua_State **)((pTVar3->value_).f + 0x10);
  }
  else if (uVar1 == 5) {
    iVar2 = luaH_getn(&((pTVar3->value_).gc)->h);
    L_local = (lua_State *)(long)iVar2;
  }
  else if (uVar1 == 7) {
    L_local = *(lua_State **)((pTVar3->value_).f + 0x20);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return (size_t)L_local;
}

Assistant:

LUA_API size_t lua_rawlen (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttypenv(o)) {
    case LUA_TSTRING: return tsvalue(o)->len;
    case LUA_TUSERDATA: return uvalue(o)->len;
    case LUA_TTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}